

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O3

void av1_dr_prediction_z1_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  undefined8 *puVar4;
  byte bVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar22;
  undefined1 auVar23 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 in_XMM9 [16];
  undefined1 auVar35 [16];
  ushort uVar42;
  undefined1 in_XMM10 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 local_438 [129];
  
  uVar6 = (ulong)(uint)bh;
  bVar5 = (byte)upsample_above;
  if (bw < 0x10) {
    if (bw == 4) {
      iVar8 = bh + 3 << (bVar5 & 0x1f);
      if (0 < bh) {
        auVar23 = pshufb(ZEXT116(above[iVar8]),(undefined1  [16])0x0);
        pauVar7 = (undefined1 (*) [16])local_438;
        uVar11 = 0;
        auVar24 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar25 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar9 = dx;
        do {
          iVar10 = (int)uVar9 >> (6 - bVar5 & 0x1f);
          uVar2 = iVar8 - iVar10 >> (bVar5 & 0x1f);
          if ((int)uVar2 < 1) {
            if ((int)uVar11 < bh) {
              lVar3 = uVar6 - uVar11;
              do {
                *pauVar7 = auVar23;
                pauVar7 = pauVar7 + 1;
                lVar3 = lVar3 + -1;
              } while (lVar3 != 0);
            }
            break;
          }
          if (3 < uVar2) {
            uVar2 = 4;
          }
          auVar14 = *(undefined1 (*) [16])(above + iVar10);
          if (upsample_above == 0) {
            auVar26 = *(undefined1 (*) [16])(above + (long)iVar10 + 1);
            auVar30 = ZEXT416(uVar9 >> 1 & 0x1f);
            auVar30 = pshuflw(auVar30,auVar30,0);
            auVar30._4_4_ = auVar30._0_4_;
            auVar30._8_4_ = auVar30._0_4_;
            auVar30._12_4_ = auVar30._0_4_;
          }
          else {
            auVar14 = pshufb(auVar14,_DAT_00513e40);
            auVar26 = auVar14 >> 0x40;
            auVar30 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
            auVar35._0_4_ = auVar30._0_4_;
            auVar35._4_4_ = auVar35._0_4_;
            auVar35._8_4_ = auVar35._0_4_;
            auVar35._12_4_ = auVar35._0_4_;
            auVar30 = psllw(auVar35,ZEXT416((uint)upsample_above));
            auVar43._0_2_ = auVar30._0_2_ >> 1;
            auVar43._2_2_ = auVar30._2_2_ >> 1;
            auVar43._4_2_ = auVar30._4_2_ >> 1;
            auVar43._6_2_ = auVar30._6_2_ >> 1;
            auVar43._8_2_ = auVar30._8_2_ >> 1;
            auVar43._10_2_ = auVar30._10_2_ >> 1;
            auVar43._12_2_ = auVar30._12_2_ >> 1;
            auVar43._14_2_ = auVar30._14_2_ >> 1;
            auVar30 = auVar43 & auVar25;
          }
          auVar35 = pmovzxbw(in_XMM9,auVar14);
          auVar44 = pmovzxbw(in_XMM10,auVar26);
          auVar43 = psllw(auVar35,5);
          in_XMM10._0_2_ = (auVar44._0_2_ - auVar35._0_2_) * auVar30._0_2_;
          in_XMM10._2_2_ = (auVar44._2_2_ - auVar35._2_2_) * auVar30._2_2_;
          in_XMM10._4_2_ = (auVar44._4_2_ - auVar35._4_2_) * auVar30._4_2_;
          in_XMM10._6_2_ = (auVar44._6_2_ - auVar35._6_2_) * auVar30._6_2_;
          in_XMM10._8_2_ = (auVar44._8_2_ - auVar35._8_2_) * auVar30._8_2_;
          in_XMM10._10_2_ = (auVar44._10_2_ - auVar35._10_2_) * auVar30._10_2_;
          in_XMM10._12_2_ = (auVar44._12_2_ - auVar35._12_2_) * auVar30._12_2_;
          in_XMM10._14_2_ = (auVar44._14_2_ - auVar35._14_2_) * auVar30._14_2_;
          uVar34 = (ushort)(auVar43._0_2_ + auVar24._0_2_ + in_XMM10._0_2_) >> 5;
          uVar36 = (ushort)(auVar43._2_2_ + auVar24._2_2_ + in_XMM10._2_2_) >> 5;
          uVar37 = (ushort)(auVar43._4_2_ + auVar24._4_2_ + in_XMM10._4_2_) >> 5;
          uVar38 = (ushort)(auVar43._6_2_ + auVar24._6_2_ + in_XMM10._6_2_) >> 5;
          uVar39 = (ushort)(auVar43._8_2_ + auVar24._8_2_ + in_XMM10._8_2_) >> 5;
          uVar40 = (ushort)(auVar43._10_2_ + auVar24._10_2_ + in_XMM10._10_2_) >> 5;
          uVar41 = (ushort)(auVar43._12_2_ + auVar24._12_2_ + in_XMM10._12_2_) >> 5;
          uVar42 = (ushort)(auVar43._14_2_ + auVar24._14_2_ + in_XMM10._14_2_) >> 5;
          auVar44._0_2_ = CONCAT11(0,auVar14[8]);
          auVar44[2] = auVar14[9];
          auVar44[3] = 0;
          auVar44[4] = auVar14[10];
          auVar44[5] = 0;
          auVar44[6] = auVar14[0xb];
          auVar44[7] = 0;
          auVar44[8] = auVar14[0xc];
          auVar44[9] = 0;
          auVar44[10] = auVar14[0xd];
          auVar44[0xb] = 0;
          auVar44[0xc] = auVar14[0xe];
          auVar44[0xd] = 0;
          auVar44[0xe] = auVar14[0xf];
          auVar44[0xf] = 0;
          auVar35 = psllw(auVar44,5);
          uVar12 = (ushort)(auVar35._0_2_ + auVar24._0_2_ +
                           (auVar26[8] - auVar44._0_2_) * auVar30._0_2_) >> 5;
          uVar16 = (ushort)(auVar35._2_2_ + auVar24._2_2_ +
                           ((ushort)auVar26[9] - (ushort)auVar14[9]) * auVar30._2_2_) >> 5;
          uVar17 = (ushort)(auVar35._4_2_ + auVar24._4_2_ +
                           ((ushort)auVar26[10] - (ushort)auVar14[10]) * auVar30._4_2_) >> 5;
          uVar18 = (ushort)(auVar35._6_2_ + auVar24._6_2_ +
                           ((ushort)auVar26[0xb] - (ushort)auVar14[0xb]) * auVar30._6_2_) >> 5;
          uVar19 = (ushort)(auVar35._8_2_ + auVar24._8_2_ +
                           ((ushort)auVar26[0xc] - (ushort)auVar14[0xc]) * auVar30._8_2_) >> 5;
          uVar20 = (ushort)(auVar35._10_2_ + auVar24._10_2_ +
                           ((ushort)auVar26[0xd] - (ushort)auVar14[0xd]) * auVar30._10_2_) >> 5;
          uVar21 = (ushort)(auVar35._12_2_ + auVar24._12_2_ +
                           ((ushort)auVar26[0xe] - (ushort)auVar14[0xe]) * auVar30._12_2_) >> 5;
          uVar22 = (ushort)(auVar35._14_2_ + auVar24._14_2_ +
                           ((ushort)auVar26[0xf] - (ushort)auVar14[0xf]) * auVar30._14_2_) >> 5;
          in_XMM9[1] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
          in_XMM9[0] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
          in_XMM9[2] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
          in_XMM9[3] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
          in_XMM9[4] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
          in_XMM9[5] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
          in_XMM9[6] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
          in_XMM9[7] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
          in_XMM9[8] = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 - (0xff < uVar12);
          in_XMM9[9] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
          in_XMM9[10] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
          in_XMM9[0xb] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
          in_XMM9[0xc] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
          in_XMM9[0xd] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
          in_XMM9[0xe] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
          in_XMM9[0xf] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
          auVar14 = pblendvb(auVar23,in_XMM9,(undefined1  [16])Mask[0][uVar2]);
          *pauVar7 = auVar14;
          uVar9 = uVar9 + dx;
          uVar11 = uVar11 + 1;
          pauVar7 = pauVar7 + 1;
        } while (uVar6 != uVar11);
        puVar4 = local_438;
        do {
          *(undefined4 *)dst = *(undefined4 *)puVar4;
          dst = dst + stride;
          puVar4 = puVar4 + 2;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    else if ((bw == 8) && (iVar8 = bh + 7 << (bVar5 & 0x1f), 0 < bh)) {
      auVar23 = pshufb(ZEXT116(above[iVar8]),(undefined1  [16])0x0);
      pauVar7 = (undefined1 (*) [16])local_438;
      uVar11 = 0;
      auVar24 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar25 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar9 = dx;
      do {
        iVar10 = (int)uVar9 >> (6 - bVar5 & 0x1f);
        uVar2 = iVar8 - iVar10 >> (bVar5 & 0x1f);
        if ((int)uVar2 < 1) {
          if ((int)uVar11 < bh) {
            lVar3 = uVar6 - uVar11;
            do {
              *pauVar7 = auVar23;
              pauVar7 = pauVar7 + 1;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
          break;
        }
        if (7 < uVar2) {
          uVar2 = 8;
        }
        auVar14 = *(undefined1 (*) [16])(above + iVar10);
        if (upsample_above == 0) {
          auVar26 = *(undefined1 (*) [16])(above + (long)iVar10 + 1);
          auVar30 = ZEXT416(uVar9 >> 1 & 0x1f);
          auVar30 = pshuflw(auVar30,auVar30,0);
          auVar29._0_4_ = auVar30._0_4_;
          auVar29._4_4_ = auVar29._0_4_;
          auVar29._8_4_ = auVar29._0_4_;
          auVar29._12_4_ = auVar29._0_4_;
        }
        else {
          auVar14 = pshufb(auVar14,_DAT_00513e40);
          auVar26 = auVar14 >> 0x40;
          auVar30 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
          auVar27._0_4_ = auVar30._0_4_;
          auVar27._4_4_ = auVar27._0_4_;
          auVar27._8_4_ = auVar27._0_4_;
          auVar27._12_4_ = auVar27._0_4_;
          auVar30 = psllw(auVar27,ZEXT416((uint)upsample_above));
          auVar28._0_2_ = auVar30._0_2_ >> 1;
          auVar28._2_2_ = auVar30._2_2_ >> 1;
          auVar28._4_2_ = auVar30._4_2_ >> 1;
          auVar28._6_2_ = auVar30._6_2_ >> 1;
          auVar28._8_2_ = auVar30._8_2_ >> 1;
          auVar28._10_2_ = auVar30._10_2_ >> 1;
          auVar28._12_2_ = auVar30._12_2_ >> 1;
          auVar28._14_2_ = auVar30._14_2_ >> 1;
          auVar29 = auVar28 & auVar25;
        }
        auVar30 = pmovzxbw(in_XMM9,auVar14);
        auVar43 = pmovzxbw(in_XMM10,auVar26);
        auVar35 = psllw(auVar30,5);
        in_XMM10._0_2_ = (auVar43._0_2_ - auVar30._0_2_) * auVar29._0_2_;
        in_XMM10._2_2_ = (auVar43._2_2_ - auVar30._2_2_) * auVar29._2_2_;
        in_XMM10._4_2_ = (auVar43._4_2_ - auVar30._4_2_) * auVar29._4_2_;
        in_XMM10._6_2_ = (auVar43._6_2_ - auVar30._6_2_) * auVar29._6_2_;
        in_XMM10._8_2_ = (auVar43._8_2_ - auVar30._8_2_) * auVar29._8_2_;
        in_XMM10._10_2_ = (auVar43._10_2_ - auVar30._10_2_) * auVar29._10_2_;
        in_XMM10._12_2_ = (auVar43._12_2_ - auVar30._12_2_) * auVar29._12_2_;
        in_XMM10._14_2_ = (auVar43._14_2_ - auVar30._14_2_) * auVar29._14_2_;
        uVar34 = (ushort)(auVar35._0_2_ + auVar24._0_2_ + in_XMM10._0_2_) >> 5;
        uVar36 = (ushort)(auVar35._2_2_ + auVar24._2_2_ + in_XMM10._2_2_) >> 5;
        uVar37 = (ushort)(auVar35._4_2_ + auVar24._4_2_ + in_XMM10._4_2_) >> 5;
        uVar38 = (ushort)(auVar35._6_2_ + auVar24._6_2_ + in_XMM10._6_2_) >> 5;
        uVar39 = (ushort)(auVar35._8_2_ + auVar24._8_2_ + in_XMM10._8_2_) >> 5;
        uVar40 = (ushort)(auVar35._10_2_ + auVar24._10_2_ + in_XMM10._10_2_) >> 5;
        uVar41 = (ushort)(auVar35._12_2_ + auVar24._12_2_ + in_XMM10._12_2_) >> 5;
        uVar42 = (ushort)(auVar35._14_2_ + auVar24._14_2_ + in_XMM10._14_2_) >> 5;
        auVar13._0_2_ = CONCAT11(0,auVar14[8]);
        auVar13[2] = auVar14[9];
        auVar13[3] = 0;
        auVar13[4] = auVar14[10];
        auVar13[5] = 0;
        auVar13[6] = auVar14[0xb];
        auVar13[7] = 0;
        auVar13[8] = auVar14[0xc];
        auVar13[9] = 0;
        auVar13[10] = auVar14[0xd];
        auVar13[0xb] = 0;
        auVar13[0xc] = auVar14[0xe];
        auVar13[0xd] = 0;
        auVar13[0xe] = auVar14[0xf];
        auVar13[0xf] = 0;
        auVar30 = psllw(auVar13,5);
        uVar12 = (ushort)(auVar30._0_2_ + auVar24._0_2_ +
                         (auVar26[8] - auVar13._0_2_) * auVar29._0_2_) >> 5;
        uVar16 = (ushort)(auVar30._2_2_ + auVar24._2_2_ +
                         ((ushort)auVar26[9] - (ushort)auVar14[9]) * auVar29._2_2_) >> 5;
        uVar17 = (ushort)(auVar30._4_2_ + auVar24._4_2_ +
                         ((ushort)auVar26[10] - (ushort)auVar14[10]) * auVar29._4_2_) >> 5;
        uVar18 = (ushort)(auVar30._6_2_ + auVar24._6_2_ +
                         ((ushort)auVar26[0xb] - (ushort)auVar14[0xb]) * auVar29._6_2_) >> 5;
        uVar19 = (ushort)(auVar30._8_2_ + auVar24._8_2_ +
                         ((ushort)auVar26[0xc] - (ushort)auVar14[0xc]) * auVar29._8_2_) >> 5;
        uVar20 = (ushort)(auVar30._10_2_ + auVar24._10_2_ +
                         ((ushort)auVar26[0xd] - (ushort)auVar14[0xd]) * auVar29._10_2_) >> 5;
        uVar21 = (ushort)(auVar30._12_2_ + auVar24._12_2_ +
                         ((ushort)auVar26[0xe] - (ushort)auVar14[0xe]) * auVar29._12_2_) >> 5;
        uVar22 = (ushort)(auVar30._14_2_ + auVar24._14_2_ +
                         ((ushort)auVar26[0xf] - (ushort)auVar14[0xf]) * auVar29._14_2_) >> 5;
        in_XMM9[1] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
        in_XMM9[0] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        in_XMM9[2] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
        in_XMM9[3] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
        in_XMM9[4] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
        in_XMM9[5] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
        in_XMM9[6] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
        in_XMM9[7] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
        in_XMM9[8] = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 - (0xff < uVar12);
        in_XMM9[9] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
        in_XMM9[10] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
        in_XMM9[0xb] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
        in_XMM9[0xc] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
        in_XMM9[0xd] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
        in_XMM9[0xe] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
        in_XMM9[0xf] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
        auVar14 = pblendvb(auVar23,in_XMM9,(undefined1  [16])Mask[0][uVar2]);
        *pauVar7 = auVar14;
        uVar9 = uVar9 + dx;
        uVar11 = uVar11 + 1;
        pauVar7 = pauVar7 + 1;
      } while (uVar6 != uVar11);
      puVar4 = local_438;
      do {
        *(undefined8 *)dst = *puVar4;
        puVar4 = puVar4 + 2;
        dst = dst + stride;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  else if (bw == 0x10) {
    iVar8 = bh + 0xf << (bVar5 & 0x1f);
    if (0 < bh) {
      auVar23 = pshufb(ZEXT116(above[iVar8]),(undefined1  [16])0x0);
      pauVar7 = (undefined1 (*) [16])local_438;
      uVar11 = 0;
      auVar24 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar25 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar9 = dx;
      do {
        iVar10 = (int)uVar9 >> (6 - bVar5 & 0x1f);
        uVar2 = iVar8 - iVar10 >> (bVar5 & 0x1f);
        if ((int)uVar2 < 1) {
          if ((int)uVar11 < bh) {
            lVar3 = uVar6 - uVar11;
            do {
              *pauVar7 = auVar23;
              pauVar7 = pauVar7 + 1;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
          break;
        }
        if (0xf < uVar2) {
          uVar2 = 0x10;
        }
        auVar14 = *(undefined1 (*) [16])(above + iVar10);
        if (upsample_above == 0) {
          auVar26 = *(undefined1 (*) [16])(above + (long)iVar10 + 1);
          auVar30 = ZEXT416(uVar9 >> 1 & 0x1f);
          auVar30 = pshuflw(auVar30,auVar30,0);
          auVar33._0_4_ = auVar30._0_4_;
          auVar33._4_4_ = auVar33._0_4_;
          auVar33._8_4_ = auVar33._0_4_;
          auVar33._12_4_ = auVar33._0_4_;
        }
        else {
          auVar14 = pshufb(auVar14,_DAT_00513e40);
          auVar26 = auVar14 >> 0x40;
          auVar30 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
          auVar31._0_4_ = auVar30._0_4_;
          auVar31._4_4_ = auVar31._0_4_;
          auVar31._8_4_ = auVar31._0_4_;
          auVar31._12_4_ = auVar31._0_4_;
          auVar30 = psllw(auVar31,ZEXT416((uint)upsample_above));
          auVar32._0_2_ = auVar30._0_2_ >> 1;
          auVar32._2_2_ = auVar30._2_2_ >> 1;
          auVar32._4_2_ = auVar30._4_2_ >> 1;
          auVar32._6_2_ = auVar30._6_2_ >> 1;
          auVar32._8_2_ = auVar30._8_2_ >> 1;
          auVar32._10_2_ = auVar30._10_2_ >> 1;
          auVar32._12_2_ = auVar30._12_2_ >> 1;
          auVar32._14_2_ = auVar30._14_2_ >> 1;
          auVar33 = auVar32 & auVar25;
        }
        auVar30 = pmovzxbw(in_XMM9,auVar14);
        auVar43 = pmovzxbw(in_XMM10,auVar26);
        auVar35 = psllw(auVar30,5);
        in_XMM10._0_2_ = (auVar43._0_2_ - auVar30._0_2_) * auVar33._0_2_;
        in_XMM10._2_2_ = (auVar43._2_2_ - auVar30._2_2_) * auVar33._2_2_;
        in_XMM10._4_2_ = (auVar43._4_2_ - auVar30._4_2_) * auVar33._4_2_;
        in_XMM10._6_2_ = (auVar43._6_2_ - auVar30._6_2_) * auVar33._6_2_;
        in_XMM10._8_2_ = (auVar43._8_2_ - auVar30._8_2_) * auVar33._8_2_;
        in_XMM10._10_2_ = (auVar43._10_2_ - auVar30._10_2_) * auVar33._10_2_;
        in_XMM10._12_2_ = (auVar43._12_2_ - auVar30._12_2_) * auVar33._12_2_;
        in_XMM10._14_2_ = (auVar43._14_2_ - auVar30._14_2_) * auVar33._14_2_;
        uVar34 = (ushort)(auVar35._0_2_ + auVar24._0_2_ + in_XMM10._0_2_) >> 5;
        uVar36 = (ushort)(auVar35._2_2_ + auVar24._2_2_ + in_XMM10._2_2_) >> 5;
        uVar37 = (ushort)(auVar35._4_2_ + auVar24._4_2_ + in_XMM10._4_2_) >> 5;
        uVar38 = (ushort)(auVar35._6_2_ + auVar24._6_2_ + in_XMM10._6_2_) >> 5;
        uVar39 = (ushort)(auVar35._8_2_ + auVar24._8_2_ + in_XMM10._8_2_) >> 5;
        uVar40 = (ushort)(auVar35._10_2_ + auVar24._10_2_ + in_XMM10._10_2_) >> 5;
        uVar41 = (ushort)(auVar35._12_2_ + auVar24._12_2_ + in_XMM10._12_2_) >> 5;
        uVar42 = (ushort)(auVar35._14_2_ + auVar24._14_2_ + in_XMM10._14_2_) >> 5;
        auVar15._0_2_ = CONCAT11(0,auVar14[8]);
        auVar15[2] = auVar14[9];
        auVar15[3] = 0;
        auVar15[4] = auVar14[10];
        auVar15[5] = 0;
        auVar15[6] = auVar14[0xb];
        auVar15[7] = 0;
        auVar15[8] = auVar14[0xc];
        auVar15[9] = 0;
        auVar15[10] = auVar14[0xd];
        auVar15[0xb] = 0;
        auVar15[0xc] = auVar14[0xe];
        auVar15[0xd] = 0;
        auVar15[0xe] = auVar14[0xf];
        auVar15[0xf] = 0;
        auVar30 = psllw(auVar15,5);
        uVar12 = (ushort)(auVar30._0_2_ + auVar24._0_2_ +
                         (auVar26[8] - auVar15._0_2_) * auVar33._0_2_) >> 5;
        uVar16 = (ushort)(auVar30._2_2_ + auVar24._2_2_ +
                         ((ushort)auVar26[9] - (ushort)auVar14[9]) * auVar33._2_2_) >> 5;
        uVar17 = (ushort)(auVar30._4_2_ + auVar24._4_2_ +
                         ((ushort)auVar26[10] - (ushort)auVar14[10]) * auVar33._4_2_) >> 5;
        uVar18 = (ushort)(auVar30._6_2_ + auVar24._6_2_ +
                         ((ushort)auVar26[0xb] - (ushort)auVar14[0xb]) * auVar33._6_2_) >> 5;
        uVar19 = (ushort)(auVar30._8_2_ + auVar24._8_2_ +
                         ((ushort)auVar26[0xc] - (ushort)auVar14[0xc]) * auVar33._8_2_) >> 5;
        uVar20 = (ushort)(auVar30._10_2_ + auVar24._10_2_ +
                         ((ushort)auVar26[0xd] - (ushort)auVar14[0xd]) * auVar33._10_2_) >> 5;
        uVar21 = (ushort)(auVar30._12_2_ + auVar24._12_2_ +
                         ((ushort)auVar26[0xe] - (ushort)auVar14[0xe]) * auVar33._12_2_) >> 5;
        uVar22 = (ushort)(auVar30._14_2_ + auVar24._14_2_ +
                         ((ushort)auVar26[0xf] - (ushort)auVar14[0xf]) * auVar33._14_2_) >> 5;
        in_XMM9[1] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
        in_XMM9[0] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        in_XMM9[2] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
        in_XMM9[3] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
        in_XMM9[4] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
        in_XMM9[5] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
        in_XMM9[6] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
        in_XMM9[7] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
        in_XMM9[8] = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 - (0xff < uVar12);
        in_XMM9[9] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
        in_XMM9[10] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
        in_XMM9[0xb] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
        in_XMM9[0xc] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
        in_XMM9[0xd] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
        in_XMM9[0xe] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
        in_XMM9[0xf] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
        auVar14 = pblendvb(auVar23,in_XMM9,(undefined1  [16])Mask[0][uVar2]);
        *pauVar7 = auVar14;
        uVar9 = uVar9 + dx;
        uVar11 = uVar11 + 1;
        pauVar7 = pauVar7 + 1;
      } while (uVar6 != uVar11);
      puVar4 = local_438;
      do {
        uVar1 = puVar4[1];
        *(undefined8 *)dst = *puVar4;
        *(undefined8 *)(dst + 8) = uVar1;
        puVar4 = puVar4 + 2;
        dst = dst + stride;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  else {
    if (bw == 0x20) {
      dr_prediction_z1_32xN_sse4_1(bh,dst,stride,above,dx,(int)left);
      return;
    }
    if (bw == 0x40) {
      dr_prediction_z1_64xN_sse4_1(bh,dst,stride,above,dx,(int)left);
      return;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    default: assert(0 && "Invalid block size");
  }
  return;
}